

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

int max_output_for_action(char *action,int cur_max)

{
  action_value aVar1;
  int iVar2;
  
  if (cur_max == -1) {
    return -1;
  }
  aVar1 = action_type(action);
  if (aVar1 < (Action_Source|Action_Bridge)) {
    if ((0xbU >> (aVar1 & 0x1f) & 1) != 0) {
      return cur_max;
    }
    if ((0x1240U >> (aVar1 & 0x1f) & 1) != 0) {
      return -1;
    }
    if ((0x30U >> (aVar1 & 0x1f) & 1) != 0) {
      iVar2 = strncmp(action,"Router Action",0xd);
      return -(uint)(iVar2 == 0) | 1;
    }
  }
  puts("Didn\'t expect case in max_output_for_action");
  exit(1);
}

Assistant:

static int
max_output_for_action(char *action, int cur_max)
{
    if (cur_max == -1) return -1;
    switch (action_type(action)) {
    case Action_NoAction:
    case Action_Terminal:
    case Action_Bridge:
	return cur_max;
    case Action_Filter:
    case Action_Immediate:
	if (strncmp(action, "Router Action", 13) == 0) {
	    /* router spec, could be lots */
	    return -1;
	}
	if (cur_max < 1) {
	    return 1;
	} else {
	    return cur_max;
	}
    case Action_Multi:
    case Action_Split:
    case Action_Source:
	return -1; /* no max */
    default:
	printf("Didn't expect case in max_output_for_action\n");
	exit(1);
    }
}